

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

shared_ptr<chrono::ChLinkMotorRotationTorque> __thiscall
chrono::curiosity::AddMotorTorque
          (curiosity *this,shared_ptr<chrono::ChBody> *body1,shared_ptr<chrono::ChBody> *body2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_pos,
          ChQuaternion<double> *rel_rot)

{
  element_type *peVar1;
  ChFrameMoving<double> *Fa;
  element_type *peVar2;
  ChSystem *pCVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chrono::ChLinkMotorRotationTorque> sVar4;
  shared_ptr<chrono::ChLinkBase> local_238;
  undefined1 local_228 [152];
  shared_ptr<chrono::ChBodyFrame> local_190;
  shared_ptr<chrono::ChBodyFrame> local_180;
  undefined1 local_169;
  ChFrame<double> local_168;
  undefined1 local_d0 [24];
  ChFrame<double> X_GC;
  ChQuaternion<double> *rel_rot_local;
  ChVector<double> *rel_pos_local;
  shared_ptr<chrono::curiosity::CuriosityChassis> *chassis_local;
  shared_ptr<chrono::ChBody> *body2_local;
  shared_ptr<chrono::ChBody> *body1_local;
  shared_ptr<chrono::ChLinkMotorRotationTorque> *motor;
  
  X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (double)rel_rot;
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)chassis);
  CuriosityPart::GetBody((CuriosityPart *)local_d0);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_d0);
  Fa = (ChFrameMoving<double> *)(**(code **)(*(long *)peVar1 + 0x1f0))();
  ChFrame<double>::ChFrame
            (&local_168,rel_pos,
             (ChQuaternion<double> *)
             X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
  ;
  chrono::operator*((ChFrame<double> *)(local_d0 + 0x10),Fa,&local_168);
  ChFrame<double>::~ChFrame(&local_168);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_d0);
  local_169 = 0;
  chrono_types::make_shared<chrono::ChLinkMotorRotationTorque,_0>();
  peVar2 = std::
           __shared_ptr_access<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>(&local_180,body1);
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>(&local_190,body2);
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)(local_228 + 0x10),(ChFrame<double> *)(local_d0 + 0x10));
  (**(code **)(*(long *)peVar2 + 0x240))(peVar2,&local_180,&local_190,local_228 + 0x10);
  ChFrame<double>::~ChFrame((ChFrame<double> *)(local_228 + 0x10));
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_190);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_180);
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)chassis);
  CuriosityPart::GetBody((CuriosityPart *)local_228);
  peVar1 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_228);
  pCVar3 = ChPhysicsItem::GetSystem((ChPhysicsItem *)peVar1);
  std::shared_ptr<chrono::ChLinkBase>::shared_ptr<chrono::ChLinkMotorRotationTorque,void>
            (&local_238,(shared_ptr<chrono::ChLinkMotorRotationTorque> *)this);
  (**(code **)(*(long *)pCVar3 + 0x138))(pCVar3,&local_238);
  std::shared_ptr<chrono::ChLinkBase>::~shared_ptr(&local_238);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_228);
  local_169 = 1;
  ChFrame<double>::~ChFrame((ChFrame<double> *)(local_d0 + 0x10));
  sVar4.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkMotorRotationTorque>)
         sVar4.super___shared_ptr<chrono::ChLinkMotorRotationTorque,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkMotorRotationTorque> AddMotorTorque(std::shared_ptr<ChBody> body1,
                                                          std::shared_ptr<ChBody> body2,
                                                          std::shared_ptr<CuriosityChassis> chassis,
                                                          const ChVector<>& rel_pos,
                                                          const ChQuaternion<>& rel_rot) {
    // Express relative frame in global
    ChFrame<> X_GC = chassis->GetBody()->GetFrame_REF_to_abs() * ChFrame<>(rel_pos, rel_rot);

    // Create motor (actuated DOF about Z axis of X_GC frame)
    auto motor = chrono_types::make_shared<ChLinkMotorRotationTorque>();
    motor->Initialize(body1, body2, X_GC);
    chassis->GetBody()->GetSystem()->AddLink(motor);

    return motor;
}